

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

Statement *
slang::ast::ForeverLoopStatement::fromSyntax
          (Compilation *compilation,ForeverStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  int iVar1;
  undefined4 extraout_var;
  ForeverLoopStatement *stmt;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  local_40;
  SourceRange local_28;
  
  local_40.func.savedFlags.m_bits = (stmtCtx->flags).m_bits;
  local_40.valid = true;
  (stmtCtx->flags).m_bits = local_40.func.savedFlags.m_bits | 1;
  local_40.func.this = stmtCtx;
  iVar1 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,(socklen_t)stmtCtx);
  local_28 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ForeverLoopStatement,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Statement *)CONCAT44(extraout_var,iVar1),
                    &local_28);
  if (((Statement *)CONCAT44(extraout_var,iVar1))->kind == Invalid) {
    stmt = (ForeverLoopStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::~ScopeGuard(&local_40);
  return &stmt->super_Statement;
}

Assistant:

Statement& ForeverLoopStatement::fromSyntax(Compilation& compilation,
                                            const ForeverStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<ForeverLoopStatement>(bodyStmt, syntax.sourceRange());
    if (bodyStmt.bad())
        return badStmt(compilation, result);

    return *result;
}